

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O3

void duckdb_parquet::swap(Statistics *a,Statistics *b)

{
  bool bVar1;
  _Statistics__isset _Var2;
  int64_t iVar3;
  
  std::__cxx11::string::swap((string *)&a->max);
  std::__cxx11::string::swap((string *)&a->min);
  iVar3 = a->null_count;
  a->null_count = b->null_count;
  b->null_count = iVar3;
  iVar3 = a->distinct_count;
  a->distinct_count = b->distinct_count;
  b->distinct_count = iVar3;
  std::__cxx11::string::swap((string *)&a->max_value);
  std::__cxx11::string::swap((string *)&a->min_value);
  bVar1 = a->is_max_value_exact;
  a->is_max_value_exact = b->is_max_value_exact;
  b->is_max_value_exact = bVar1;
  bVar1 = a->is_min_value_exact;
  a->is_min_value_exact = b->is_min_value_exact;
  b->is_min_value_exact = bVar1;
  _Var2 = a->__isset;
  a->__isset = b->__isset;
  b->__isset = _Var2;
  return;
}

Assistant:

void swap(Statistics &a, Statistics &b) {
  using ::std::swap;
  swap(a.max, b.max);
  swap(a.min, b.min);
  swap(a.null_count, b.null_count);
  swap(a.distinct_count, b.distinct_count);
  swap(a.max_value, b.max_value);
  swap(a.min_value, b.min_value);
  swap(a.is_max_value_exact, b.is_max_value_exact);
  swap(a.is_min_value_exact, b.is_min_value_exact);
  swap(a.__isset, b.__isset);
}